

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Arena *arena;
  RepeatedPtrFieldBase *in_RSI;
  RepeatedPtrFieldBase *in_RDI;
  RepeatedPtrFieldBase *in_stack_00000018;
  RepeatedPtrFieldBase *in_stack_00000020;
  RepeatedPtrFieldBase temp;
  RepeatedPtrFieldBase local_78 [2];
  RepeatedPtrFieldBase *in_stack_ffffffffffffffc8;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffd0;
  
  arena = GetArena(in_RSI);
  RepeatedPtrFieldBase(local_78,arena);
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (in_stack_ffffffffffffffd0);
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  InternalSwap(in_stack_00000020,in_stack_00000018);
  Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(in_RDI);
  ~RepeatedPtrFieldBase(local_78);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(other->GetArena() != GetArena());

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied twice rather than
  // three times.
  RepeatedPtrFieldBase temp(other->GetArena());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}